

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesPathWidget.cxx
# Opt level: O3

void __thiscall
cmCursesPathWidget::cmCursesPathWidget
          (cmCursesPathWidget *this,int width,int height,int left,int top)

{
  FIELD *field;
  bool bVar1;
  chtype attr;
  
  cmCursesStringWidget::cmCursesStringWidget
            (&this->super_cmCursesStringWidget,width,height,left,top);
  (this->super_cmCursesStringWidget).super_cmCursesWidget._vptr_cmCursesWidget =
       (_func_int **)&PTR__cmCursesPathWidget_00a05d98;
  (this->LastString)._M_dataplus._M_p = (pointer)&(this->LastString).field_2;
  (this->LastString)._M_string_length = 0;
  (this->LastString).field_2._M_local_buf[0] = '\0';
  (this->LastGlob)._M_dataplus._M_p = (pointer)&(this->LastGlob).field_2;
  (this->LastGlob)._M_string_length = 0;
  (this->LastGlob).field_2._M_local_buf[0] = '\0';
  (this->super_cmCursesStringWidget).super_cmCursesWidget.Type = PATH;
  this->Cycle = false;
  this->CurrentIndex = 0;
  bVar1 = cmCursesColor::HasColors();
  field = (this->super_cmCursesStringWidget).super_cmCursesWidget.Field;
  if (bVar1) {
    attr = 0x400;
    set_field_fore(field,0x400);
  }
  else {
    attr = 0x10000;
    set_field_fore(field,0);
  }
  set_field_back((this->super_cmCursesStringWidget).super_cmCursesWidget.Field,attr);
  return;
}

Assistant:

cmCursesPathWidget::cmCursesPathWidget(int width, int height, int left,
                                       int top)
  : cmCursesStringWidget(width, height, left, top)
{
  this->Type = cmStateEnums::PATH;
  this->Cycle = false;
  this->CurrentIndex = 0;
  if (cmCursesColor::HasColors()) {
    set_field_fore(this->Field, COLOR_PAIR(cmCursesColor::Path));
    set_field_back(this->Field, COLOR_PAIR(cmCursesColor::Path));
  } else {
    set_field_fore(this->Field, A_NORMAL);
    set_field_back(this->Field, A_STANDOUT);
  }
}